

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

agr * __thiscall
agr::except_error_func<std::out_of_range>(agr *this,string *beg,string *var,string *end)

{
  int iVar1;
  ostream *poVar2;
  char *local_70;
  undefined8 local_68;
  undefined2 local_60;
  undefined1 uStack_5e;
  undefined5 uStack_5d;
  char *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined1 uStack_3e;
  undefined5 uStack_3d;
  
  if (except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
      ::oss_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                                 ::oss_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)
                 &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                  ::oss_abi_cxx11_);
      __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                   &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                    ::oss_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                           ::oss_abi_cxx11_);
    }
  }
  local_70 = (char *)&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  std::__cxx11::stringbuf::str((string *)&DAT_0014d510);
  if (local_70 != (char *)&local_60) {
    operator_delete(local_70,CONCAT53(uStack_5d,CONCAT12(uStack_5e,local_60)) + 1);
  }
  std::ios::clear((int)*(undefined8 *)
                        (except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                         ::oss_abi_cxx11_ + -0x18) + 0x14d508);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
              ::oss_abi_cxx11_,"\x1b[31m",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)
                      &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                       ::oss_abi_cxx11_,(beg->_M_dataplus)._M_p,beg->_M_string_length);
  local_60 = 0x2220;
  local_68 = 2;
  uStack_5e = 0;
  local_70 = (char *)&local_60;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_60,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[1m",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(var->_M_dataplus)._M_p,var->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[22m",5);
  local_40 = 0x2022;
  local_48 = 2;
  uStack_3e = 0;
  local_50 = (char *)&local_40;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_40,2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(end->_M_dataplus)._M_p,end->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[39m",5);
  if (local_50 != (char *)&local_40) {
    operator_delete(local_50,CONCAT53(uStack_3d,CONCAT12(uStack_3e,local_40)) + 1);
  }
  if (local_70 != (char *)&local_60) {
    operator_delete(local_70,CONCAT53(uStack_5d,CONCAT12(uStack_5e,local_60)) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::out_of_range::out_of_range((out_of_range *)this,(string *)&local_70);
  if (local_70 != (char *)&local_60) {
    operator_delete(local_70,CONCAT53(uStack_5d,CONCAT12(uStack_5e,local_60)) + 1);
  }
  return this;
}

Assistant:

inline T_err except_error_func( const std::string& beg = "", std::string var = nullptr, const std::string& end = "" )
   {
    using namespace std::literals::string_literals;

    static std::ostringstream oss;
    oss.str( "" );
    oss.clear();
    oss << "\033[31m" << beg << " \""s << "\033[1m" << var << "\033[22m" << "\" "s << end << "\033[39m";

    return T_err( oss.str() ); 
   }